

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledHorizontal.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorTiledHorizontal::Initialise
          (DecoratorTiledHorizontal *this,Tile *_tiles,Texture *_textures)

{
  int iVar1;
  int local_2c;
  int i;
  Texture *_textures_local;
  Tile *_tiles_local;
  DecoratorTiledHorizontal *this_local;
  
  for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
    memcpy(&this->field_0x30 + (long)local_2c * 0x4c,_tiles + local_2c,0x4c);
    iVar1 = Decorator::AddTexture((Decorator *)this,_textures[local_2c]);
    *(int *)(&this->field_0x30 + (long)local_2c * 0x4c) = iVar1;
  }
  if ((*(int *)&this->field_0x30 == -1) && (-1 < *(int *)&this->field_0x7c)) {
    memcpy(&this->field_0x30,&this->field_0x7c,0x4c);
    *(undefined4 *)&this->field_0x64 = 1;
  }
  else if ((*(int *)&this->field_0x7c == -1) && (-1 < *(int *)&this->field_0x30)) {
    memcpy(&this->field_0x7c,&this->field_0x30,0x4c);
    *(undefined4 *)&this->field_0xb0 = 1;
  }
  else if ((*(int *)&this->field_0x30 == -1) && (*(int *)&this->field_0x7c == -1)) {
    return false;
  }
  return *(int *)&this->field_0xc8 != -1;
}

Assistant:

bool DecoratorTiledHorizontal::Initialise(const Tile* _tiles, const Texture* _textures)
{
	// Load the textures.
	for (int i = 0; i < 3; i++)
	{
		tiles[i] = _tiles[i];
		tiles[i].texture_index = AddTexture(_textures[i]);
	}

	// If only one side of the decorator has been configured, then mirror the texture for the other side.
	if (tiles[LEFT].texture_index == -1 && tiles[RIGHT].texture_index > -1)
	{
		tiles[LEFT] = tiles[RIGHT];
		tiles[LEFT].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[RIGHT].texture_index == -1 && tiles[LEFT].texture_index > -1)
	{
		tiles[RIGHT] = tiles[LEFT];
		tiles[RIGHT].orientation = FLIP_HORIZONTAL;
	}
	else if (tiles[LEFT].texture_index == -1 && tiles[RIGHT].texture_index == -1)
		return false;

	if (tiles[CENTRE].texture_index == -1)
		return false;

	return true;
}